

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::PipelineRegressor::~PipelineRegressor(PipelineRegressor *this)

{
  InternalMetadata *this_00;
  Pipeline *this_01;
  ulong uVar1;
  undefined8 *puVar2;
  
  this_00 = &(this->super_MessageLite)._internal_metadata_;
  uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  puVar2 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    puVar2 = (undefined8 *)*puVar2;
  }
  if (puVar2 == (undefined8 *)0x0) {
    if (this != (PipelineRegressor *)_PipelineRegressor_default_instance_) {
      this_01 = this->pipeline_;
      if (this_01 != (Pipeline *)0x0) {
        Pipeline::~Pipeline(this_01);
      }
      operator_delete(this_01,0x48);
      uVar1 = this_00->ptr_;
    }
    if ((uVar1 & 1) != 0) {
      google::protobuf::internal::InternalMetadata::DeleteOutOfLineHelper<std::__cxx11::string>
                (this_00);
    }
  }
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__MessageLite_004915d0;
  google::protobuf::internal::InternalMetadata::~InternalMetadata(this_00);
  return;
}

Assistant:

PipelineRegressor::~PipelineRegressor() {
  // @@protoc_insertion_point(destructor:CoreML.Specification.PipelineRegressor)
  if (GetArenaForAllocation() != nullptr) return;
  SharedDtor();
  _internal_metadata_.Delete<std::string>();
}